

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int sign_frommemory(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  undefined8 *puVar1;
  uchar *__s2;
  size_t __n;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  LIBSSH2_HOSTKEY_METHOD **ppLVar5;
  char *errmsg;
  LIBSSH2_HOSTKEY_METHOD *pLVar6;
  void *hostkey_abstract;
  iovec datavec;
  void *local_78;
  uchar *local_70;
  size_t local_68;
  uchar **local_60;
  size_t *local_58;
  char *local_50;
  uchar *local_48;
  iovec local_40;
  
  puVar1 = (undefined8 *)*abstract;
  __s2 = session->userauth_pblc_method;
  __n = session->userauth_pblc_method_len;
  local_48 = (uchar *)*puVar1;
  local_50 = (char *)puVar1[1];
  sVar2 = puVar1[2];
  local_70 = data;
  local_68 = data_len;
  local_60 = sig;
  local_58 = sig_len;
  ppLVar5 = libssh2_hostkey_methods();
  local_78 = (void *)0x0;
  pLVar6 = *ppLVar5;
  while (pLVar6 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    ppLVar5 = ppLVar5 + 1;
    if (pLVar6->name == (char *)0x0) break;
    if ((pLVar6->initPEMFromMemory !=
         (_func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar3 = strncmp(pLVar6->name,(char *)__s2,__n), iVar3 == 0)) goto LAB_0012dec5;
    pLVar6 = *ppLVar5;
  }
  pLVar6 = (LIBSSH2_HOSTKEY_METHOD *)0x0;
LAB_0012dec5:
  if (pLVar6 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    errmsg = "No handler for specified private key";
    iVar3 = -0x11;
  }
  else {
    iVar3 = (*pLVar6->initPEMFromMemory)(session,local_50,sVar2,local_48,&local_78);
    if (iVar3 == 0) {
      uVar4 = 0;
      goto LAB_0012df0e;
    }
    errmsg = "Unable to initialize private key from memory";
    iVar3 = -0x10;
  }
  uVar4 = _libssh2_error(session,iVar3,errmsg);
LAB_0012df0e:
  if (uVar4 == 0 && pLVar6 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    local_40.iov_base = local_70;
    local_40.iov_len = local_68;
    iVar3 = (*pLVar6->signv)(session,local_60,local_58,1,&local_40,&local_78);
    uVar4 = -(uint)(iVar3 != 0);
    if (pLVar6->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*pLVar6->dtor)(session,&local_78);
    }
  }
  else {
    uVar4 = -(uint)(uVar4 == 0) | uVar4;
  }
  return uVar4;
}

Assistant:

static int
sign_frommemory(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_mem *pk_mem = (struct privkey_mem *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = memory_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                                session->userauth_pblc_method,
                                session->userauth_pblc_method_len,
                                pk_mem->data,
                                pk_mem->data_len,
                                pk_mem->passphrase);
    if(rc)
        return rc;

    if(!privkeyobj)
        return -1;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)LIBSSH2_UNCONST(data);
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}